

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O3

void free_dfg_state(EVdfg_configuration state)

{
  char **__ptr;
  EVdfg_stone_state __ptr_00;
  long lVar1;
  long lVar2;
  
  if (0 < state->stone_count) {
    lVar1 = 0;
    do {
      __ptr_00 = state->stones[lVar1];
      if (__ptr_00->out_links != (int *)0x0) {
        free(__ptr_00->out_links);
        __ptr_00 = state->stones[lVar1];
      }
      if (__ptr_00->in_links != (int *)0x0) {
        free(__ptr_00->in_links);
        __ptr_00 = state->stones[lVar1];
      }
      if (__ptr_00->action != (char *)0x0) {
        free(__ptr_00->action);
        __ptr_00 = state->stones[lVar1];
      }
      __ptr = __ptr_00->extra_actions;
      if (__ptr != (char **)0x0) {
        if (1 < __ptr_00->action_count) {
          lVar2 = 0;
          do {
            free(__ptr_00->extra_actions[lVar2]);
            lVar2 = lVar2 + 1;
            __ptr_00 = state->stones[lVar1];
          } while (lVar2 < (long)__ptr_00->action_count + -1);
          __ptr = __ptr_00->extra_actions;
        }
        free(__ptr);
        __ptr_00 = state->stones[lVar1];
      }
      if (__ptr_00->attrs != (attr_list)0x0) {
        free_attr_list(__ptr_00->attrs);
        __ptr_00 = state->stones[lVar1];
      }
      free(__ptr_00);
      lVar1 = lVar1 + 1;
    } while (lVar1 < state->stone_count);
  }
  if (state->pending_action_queue != (_EVdfg_config_action *)0x0) {
    free(state->pending_action_queue);
  }
  free(state->stones);
  free(state);
  return;
}

Assistant:

static void
free_dfg_state(EVdfg_configuration state)
{
    int i;
    for (i=0; i < state->stone_count; i++) {
    	if (state->stones[i]->out_links) free(state->stones[i]->out_links);
    	if (state->stones[i]->in_links) free(state->stones[i]->in_links);
    	if (state->stones[i]->action) free(state->stones[i]->action);
    	if (state->stones[i]->extra_actions) {
    	    int j;
    	    for (j=0; j < state->stones[i]->action_count-1; j++) {
    		free(state->stones[i]->extra_actions[j]);
    	    }
    	    free(state->stones[i]->extra_actions);
    	}
    	if (state->stones[i]->attrs) free_attr_list(state->stones[i]->attrs);
    	free(state->stones[i]);
    }
    if (state->pending_action_queue) free(state->pending_action_queue);
    free(state->stones);
    free(state);
}